

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_types.h
# Opt level: O0

void __thiscall
Clasp::SingleOwnerPtr<Clasp::Enumerator,_Clasp::DeleteObject>::reset
          (SingleOwnerPtr<Clasp::Enumerator,_Clasp::DeleteObject> *this,Enumerator *x)

{
  bool bVar1;
  Enumerator *pEVar2;
  _func_int **pp_Var3;
  Enumerator *in_RSI;
  Enumerator *in_RDI;
  DeleteObject deleter;
  
  pEVar2 = get((SingleOwnerPtr<Clasp::Enumerator,_Clasp::DeleteObject> *)0x12f106);
  if ((in_RSI != pEVar2) &&
     (bVar1 = is_owner((SingleOwnerPtr<Clasp::Enumerator,_Clasp::DeleteObject> *)0x12f11c), bVar1))
  {
    release((SingleOwnerPtr<Clasp::Enumerator,_Clasp::DeleteObject> *)in_RSI);
    DeleteObject::operator()((DeleteObject *)in_RSI,in_RDI);
  }
  pp_Var3 = (_func_int **)
            set_bit<unsigned_long>((unsigned_long)in_RSI,(uint)((ulong)in_RDI >> 0x20));
  in_RDI->_vptr_Enumerator = pp_Var3;
  return;
}

Assistant:

void reset(T* x)             {
		if (x != get() && is_owner()) { D deleter; deleter(release()); }
		ptr_ = set_bit(uintp(x),0);
	}